

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CosineSeriesBendType.hpp
# Opt level: O0

void __thiscall
OpenMD::CosineSeriesBendType::calcForce
          (CosineSeriesBendType *this,RealType theta,RealType *V,RealType *dVdtheta)

{
  double dVar1;
  double dVar2;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double dVar5;
  RealType st;
  RealType ct;
  
  dVar3 = cos(in_XMM0_Qa);
  dVar4 = sin(in_XMM0_Qa);
  *in_RSI = *(double *)(in_RDI + 0x10) *
            (*(double *)(in_RDI + 0x28) * (dVar3 * 2.0 * dVar3 + -1.0) +
            *(double *)(in_RDI + 0x20) * dVar3 + *(double *)(in_RDI + 0x18));
  dVar3 = *(double *)(in_RDI + 0x10);
  dVar1 = *(double *)(in_RDI + 0x20);
  dVar2 = *(double *)(in_RDI + 0x28);
  dVar5 = sin(in_XMM0_Qa * 2.0);
  *in_RDX = -dVar3 * (dVar1 * dVar4 + dVar2 * 2.0 * dVar5);
  return;
}

Assistant:

void calcForce(RealType theta, RealType& V, RealType& dVdtheta) {
      RealType ct = cos(theta);
      RealType st = sin(theta);

      // use cos 2t = (2 cos^2 - 1)
      V        = k_ * (c0_ + c1_ * ct + c2_ * (2.0 * ct * ct - 1.0));
      dVdtheta = -k_ * (c1_ * st + 2.0 * c2_ * sin(2.0 * theta));
    }